

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routes.c
# Opt level: O1

int exec_route(char *prefix,mg_connection *conn)

{
  int iVar1;
  route *__src;
  char local_430 [8];
  route aux;
  
  if (aux.prefix._1016_8_ != 0) {
    __src = route_array;
    do {
      memcpy(local_430,__src,0x408);
      iVar1 = strcmp(local_430,prefix);
      if (iVar1 == 0) {
        iVar1 = (*(code *)aux.prefix._1016_8_)(conn);
        return iVar1;
      }
      __src = __src + 1;
    } while (aux.prefix._1016_8_ != 0);
  }
  return 0x194;
}

Assistant:

int exec_route(const char *prefix, struct mg_connection *conn) {
	int i, rc;
	route aux;

	for (i = 0; aux.fn != NULL; i++) {
		aux = route_array[i];
		if ((rc = strcmp(aux.prefix, prefix)) == 0) {
			return aux.fn(conn);
		}
	}

	return 404;
}